

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

long NGA_Read_inc(int g_a,int *subscript,long inc)

{
  Integer IVar1;
  undefined8 in_RDX;
  long in_RSI;
  int in_EDI;
  int i;
  Integer _ga_lo [7];
  Integer in;
  Integer ndim;
  Integer a;
  Integer in_stack_00000180;
  Integer in_stack_00000918;
  Integer *in_stack_00000920;
  Integer in_stack_00000928;
  int local_6c;
  long local_68 [7];
  undefined8 local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = pnga_ndim(in_stack_00000180);
  local_30 = local_18;
  for (local_6c = 0; local_6c < local_28; local_6c = local_6c + 1) {
    local_68[(local_28 - local_6c) + -1] = (long)*(int *)(local_10 + (long)local_6c * 4) + 1;
  }
  IVar1 = pnga_read_inc(in_stack_00000928,in_stack_00000920,in_stack_00000918);
  return IVar1;
}

Assistant:

long NGA_Read_inc(int g_a, int subscript[], long inc)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer in=(Integer)inc;
    Integer _ga_lo[MAXDIM];
    COPYINDEX_C2F(subscript, _ga_lo, ndim);
    return (long)wnga_read_inc(a, _ga_lo, in);
}